

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O2

void Search::del_neighbor_features(search_private *priv,multi_ex *ec_seq)

{
  pointer ppeVar1;
  size_t n;
  ulong uVar2;
  
  if ((priv->neighbor_features)._end != (priv->neighbor_features)._begin) {
    for (uVar2 = 0;
        ppeVar1 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_start,
        uVar2 < (ulong)((long)(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar1 >> 3);
        uVar2 = uVar2 + 1) {
      del_features_in_top_namespace(priv,ppeVar1[uVar2],0x83);
    }
  }
  return;
}

Assistant:

inline size_t size() const { return _end - _begin; }